

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilder::TrackField(FlatBufferBuilder *this,voffset_t field,uoffset_t off)

{
  value_type local_20;
  FieldLoc fl;
  uoffset_t off_local;
  voffset_t field_local;
  FlatBufferBuilder *this_local;
  
  local_20.off = off;
  local_20.id = field;
  fl.off = off;
  fl._6_2_ = field;
  std::
  vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
  ::push_back(&this->offsetbuf_,&local_20);
  return;
}

Assistant:

void TrackField(voffset_t field, uoffset_t off) {
    FieldLoc fl = { off, field };
    offsetbuf_.push_back(fl);
  }